

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::LinearConstraint::setControlConstraintMatrix
          (LinearConstraint *this,MatrixDynSize *constraintMatrix)

{
  size_t sVar1;
  size_t sVar2;
  string *psVar3;
  __shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_38;
  
  sVar1 = iDynTree::MatrixDynSize::rows();
  sVar2 = Constraint::constraintSize(&this->super_Constraint);
  if (sVar1 == sVar2) {
    std::
    make_shared<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,iDynTree::MatrixDynSize_const&>
              ((MatrixDynSize *)&_Stack_38);
    std::
    __shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,(__gnu_cxx::_Lock_policy)2>
                 *)&this->m_pimpl->controlConstraintMatrix,&_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
    this->m_pimpl->constrainsControl = true;
  }
  else {
    psVar3 = Constraint::name_abi_cxx11_(&this->super_Constraint);
    iDynTree::reportError
              ((psVar3->_M_dataplus)._M_p,"setControlConstraintMatrix",
               "The number of rows of the constraintMatrix is different from the specified constraint size."
              );
  }
  return sVar1 == sVar2;
}

Assistant:

bool LinearConstraint::setControlConstraintMatrix(const MatrixDynSize &constraintMatrix)
        {
            if (constraintMatrix.rows() != constraintSize()) {
                reportError(name().c_str(), "setControlConstraintMatrix", "The number of rows of the constraintMatrix is different from the specified constraint size.");
                return false;
            }

            m_pimpl->controlConstraintMatrix = std::make_shared<TimeInvariantMatrix>(constraintMatrix);
            m_pimpl->constrainsControl = true;

            return true;
        }